

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BVHLoader.cpp
# Opt level: O2

void __thiscall Assimp::BVHLoader::ReadHierarchy(BVHLoader *this,aiScene *pScene)

{
  bool bVar1;
  aiNode *paVar2;
  string root;
  allocator<char> local_59;
  string local_58;
  string local_38;
  
  GetNextToken_abi_cxx11_(&local_38,this);
  bVar1 = std::operator!=(&local_38,"ROOT");
  if (!bVar1) {
    paVar2 = ReadNode(this);
    pScene->mRootNode = paVar2;
    std::__cxx11::string::~string((string *)&local_38);
    return;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"Expected root node \"ROOT\".",&local_59);
  ThrowException(this,&local_58);
}

Assistant:

void BVHLoader::ReadHierarchy( aiScene* pScene)
{
    std::string root = GetNextToken();
    if( root != "ROOT")
        ThrowException( "Expected root node \"ROOT\".");

    // Go read the hierarchy from here
    pScene->mRootNode = ReadNode();
}